

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O1

void __thiscall libDAI::FactorGraph::backupFactors(FactorGraph *this,VarSet *ns)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t I;
  
  iVar2 = (*(this->super_GraphicalModel)._vptr_GraphicalModel[9])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    I = 0;
    do {
      iVar2 = (*(this->super_GraphicalModel)._vptr_GraphicalModel[10])(this,I);
      bVar1 = VarSet::operator&&((VarSet *)CONCAT44(extraout_var_00,iVar2),ns);
      if (bVar1) {
        backupFactor(this,I);
      }
      I = I + 1;
      iVar2 = (*(this->super_GraphicalModel)._vptr_GraphicalModel[9])(this);
    } while (I < CONCAT44(extraout_var_01,iVar2));
  }
  return;
}

Assistant:

void FactorGraph::backupFactors( const VarSet &ns ) {
        for( size_t I = 0; I < nrFactors(); I++ )
            if( factor(I).vars() && ns )
                backupFactor( I );
    }